

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

float Rml::ComputeLength(NumericValue value,float font_size,float document_font_size,float dp_ratio,
                        Vector2f vp_dimensions)

{
  code *pcVar1;
  bool bVar2;
  int line;
  float fVar3;
  Unit UVar4;
  float fVar5;
  
  fVar5 = vp_dimensions.y;
  fVar3 = value.number;
  UVar4 = value.unit;
  if (((ulong)value >> 0x20 & 0x3e000) == 0) {
    if ((int)UVar4 < 0x200) {
      if (UVar4 == PX) {
        return fVar3;
      }
      if (UVar4 == DP) {
        return fVar3 * dp_ratio;
      }
      fVar5 = vp_dimensions.x;
      if (UVar4 == VW) {
LAB_001e5298:
        return fVar5 * fVar3 * 0.01;
      }
    }
    else {
      if (UVar4 == VH) goto LAB_001e5298;
      if (UVar4 == REM) {
        return fVar3 * document_font_size;
      }
      if (UVar4 == EM) {
        return fVar3 * font_size;
      }
    }
    line = 0x60;
  }
  else {
    fVar5 = fVar3 * 96.0 * dp_ratio;
    if ((int)UVar4 < 0x8000) {
      if (UVar4 == INCH) {
        return fVar5;
      }
      if (UVar4 == CM) {
        return fVar5 * 0.39370078;
      }
    }
    else {
      if (UVar4 == MM) {
        return fVar5 * 0.03937008;
      }
      if (UVar4 == PT) {
        return fVar5 * 0.013888889;
      }
      if (UVar4 == PC) {
        return fVar5 * 0.16666667;
      }
    }
    line = 0x4c;
  }
  bVar2 = Assert("RMLUI_ERROR",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                 ,line);
  if (bVar2) {
    return 0.0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

float ComputeLength(NumericValue value, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(value.unit & Unit::PPI_UNIT))
		return ComputePPILength(value, dp_ratio);

	switch (value.unit)
	{
	case Unit::PX: return value.number;
	case Unit::EM: return value.number * font_size;
	case Unit::REM: return value.number * document_font_size;
	case Unit::DP: return value.number * dp_ratio;
	case Unit::VW: return value.number * vp_dimensions.x * 0.01f;
	case Unit::VH: return value.number * vp_dimensions.y * 0.01f;
	default: break;
	}

	RMLUI_ERROR;
	return 0.0f;
}